

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

void cppnet::GetFormatTime(char *buf,uint32_t *len,FormatTimeUnit unit)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  size_t __maxlen;
  ulong uVar5;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar6;
  undefined8 in_stack_ffffffffffffff80;
  ulong uVar7;
  undefined4 uVar8;
  undefined8 in_stack_ffffffffffffff88;
  ulong uVar9;
  undefined4 uVar10;
  tm time;
  time_t now_time_t;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  lVar2 = std::chrono::_V2::system_clock::now();
  now_time_t = lVar2 / 1000000000;
  if (unit == FTU_MILLISECOND) {
    Localtime((uint64_t *)&now_time_t,&time);
    __maxlen = (size_t)*len;
    uVar3 = (ulong)(time.tm_year + 0x76c);
    pcVar4 = "%04d-%02d-%02d:%02d:%02d:%02d:%03d";
LAB_00109217:
    uVar9 = (ulong)(uint)time.tm_sec;
    uVar7 = (ulong)(uint)time.tm_min;
    uVar5 = (ulong)(uint)time.tm_hour;
LAB_00109219:
    uVar1 = snprintf(buf,__maxlen,pcVar4,uVar3,(ulong)(time.tm_mon + 1),(ulong)(uint)time.tm_mday,
                     uVar5,uVar7,uVar9);
    goto LAB_00109222;
  }
  Localtime((uint64_t *)&now_time_t,&time);
  __maxlen = (size_t)*len;
  uVar3 = (ulong)(time.tm_year + 0x76c);
  switch(unit) {
  case FTU_YEAR:
    uVar1 = snprintf(buf,__maxlen,"%04d",uVar3);
    break;
  case FTU_MONTH:
    uVar1 = snprintf(buf,__maxlen,"%04d-%02d",uVar3,(ulong)(time.tm_mon + 1));
    break;
  case FTU_DAY:
    uVar1 = snprintf(buf,__maxlen,"%04d-%02d-%02d",uVar3,(ulong)(time.tm_mon + 1),
                     (ulong)(uint)time.tm_mday);
    break;
  case FTU_HOUR:
    pcVar4 = "%04d-%02d-%02d:%02d";
    goto LAB_001092ee;
  case FTU_MINUTE:
    pcVar4 = "%04d-%02d-%02d:%02d:%02d";
LAB_001092ee:
    uVar1 = snprintf(buf,__maxlen,pcVar4,uVar3,(ulong)(time.tm_mon + 1),(ulong)(uint)time.tm_mday,
                     (ulong)(uint)time.tm_hour);
    break;
  case FTU_SECOND:
    pcVar4 = "%04d-%02d-%02d:%02d:%02d:%02d";
    goto LAB_00109217;
  default:
    uVar9 = CONCAT44(uVar10,time.tm_sec);
    uVar7 = CONCAT44(uVar8,time.tm_min);
    uVar5 = CONCAT44(uVar6,time.tm_hour);
    pcVar4 = "%04d-%02d-%02d:%02d:%02d:%02d:%03d";
    goto LAB_00109219;
  }
LAB_00109222:
  *len = uVar1;
  return;
}

Assistant:

void GetFormatTime(char* buf, uint32_t& len, FormatTimeUnit unit) {
    auto now_time = std::chrono::system_clock::now();
    auto now_time_t = std::chrono::system_clock::to_time_t(now_time);
    
    int32_t millisecond = 0;
    if (unit == FTU_MILLISECOND) {
        auto msec = std::chrono::duration_cast<std::chrono::milliseconds>(now_time.time_since_epoch()).count();
        auto sec = std::chrono::duration_cast<std::chrono::seconds>(now_time.time_since_epoch()).count();
        millisecond = (int32_t)(msec - (sec * 1000));
    }
    
    tm time;
    Localtime((uint64_t*)&now_time_t, (void*)&time);
    switch (unit)
    {
    case FTU_MILLISECOND:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d:%03d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec, millisecond);
        break;
    case FTU_SECOND:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec);
        break;
    case FTU_MINUTE:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min);
        break;
    case FTU_HOUR:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour);
        break;
    case FTU_DAY:
        len = snprintf(buf, len, "%04d-%02d-%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday);
        break;
    case FTU_MONTH:
        len = snprintf(buf, len, "%04d-%02d", 1900 + time.tm_year,  1 + time.tm_mon);
        break;
    case FTU_YEAR:
        len = snprintf(buf, len, "%04d", 1900 + time.tm_year);
        break;
    default:
        // default FTU_MILLISECOND
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d:%03d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec, millisecond);
        break;
    }
}